

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaMuxes.c
# Opt level: O1

void Mux_ManFree(Mux_Man_t *p)

{
  Vec_Wec_t *__ptr;
  void *__ptr_00;
  long lVar1;
  long lVar2;
  
  Abc_NamStop(p->pNames);
  __ptr = p->vTops;
  if (0 < __ptr->nCap) {
    lVar2 = 8;
    lVar1 = 0;
    do {
      __ptr_00 = *(void **)((long)&__ptr->pArray->nCap + lVar2);
      if (__ptr_00 != (void *)0x0) {
        free(__ptr_00);
        *(undefined8 *)((long)&__ptr->pArray->nCap + lVar2) = 0;
      }
      lVar1 = lVar1 + 1;
      lVar2 = lVar2 + 0x10;
    } while (lVar1 < __ptr->nCap);
  }
  if (__ptr->pArray != (Vec_Int_t *)0x0) {
    free(__ptr->pArray);
    __ptr->pArray = (Vec_Int_t *)0x0;
  }
  __ptr->nCap = 0;
  __ptr->nSize = 0;
  free(__ptr);
  if (p != (Mux_Man_t *)0x0) {
    free(p);
    return;
  }
  return;
}

Assistant:

void Mux_ManFree( Mux_Man_t * p )
{
    Abc_NamStop( p->pNames );
    Vec_WecFree( p->vTops );
    ABC_FREE( p );
}